

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall
soul::AST::Graph::Graph
          (Graph *this,CodeLocation *processorKeyword,Context *processorName,Identifier moduleName)

{
  CodeLocation local_38;
  Context *local_28;
  Context *processorName_local;
  CodeLocation *processorKeyword_local;
  Graph *this_local;
  Identifier moduleName_local;
  
  local_28 = processorName;
  processorName_local = (Context *)processorKeyword;
  processorKeyword_local = (CodeLocation *)this;
  this_local = (Graph *)moduleName.name;
  CodeLocation::CodeLocation(&local_38,processorKeyword);
  ProcessorBase::ProcessorBase
            (&this->super_ProcessorBase,Graph,&local_38,local_28,(Identifier)this_local);
  CodeLocation::~CodeLocation(&local_38);
  (this->super_ProcessorBase).super_ModuleBase.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__Graph_005873e8;
  (this->super_ProcessorBase).super_ModuleBase.super_Scope._vptr_Scope =
       (_func_int **)&PTR__Graph_005874b8;
  std::
  vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
  ::vector(&this->processorInstances);
  std::
  vector<soul::pool_ref<soul::AST::Connection>,_std::allocator<soul::pool_ref<soul::AST::Connection>_>_>
  ::vector(&this->connections);
  std::
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  ::vector(&this->constants);
  std::
  vector<soul::pool_ref<soul::AST::ProcessorAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::ProcessorAliasDeclaration>_>_>
  ::vector(&this->processorAliases);
  return;
}

Assistant:

Graph (CodeLocation processorKeyword, const Context& processorName, Identifier moduleName)
            : ProcessorBase (ObjectType::Graph, processorKeyword, processorName, moduleName) {}